

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::ConstPixelBufferAccess::sample3DOffset
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float s,float t,float r,
          IVec3 *offset)

{
  WrapMode WVar1;
  FilterMode FVar2;
  FilterMode FVar3;
  WrapMode WVar4;
  WrapMode WVar5;
  WrapMode mode;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int j;
  int k;
  int iVar15;
  undefined4 in_register_00000014;
  Sampler *sampler_00;
  int iVar16;
  int i;
  int *in_R8;
  int iVar17;
  int iVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float s_00;
  float s_01;
  float s_02;
  undefined8 extraout_XMM0_Qa;
  undefined4 in_XMM1_Db;
  undefined8 uVar31;
  Vec4 VVar32;
  Vec4 VVar33;
  Vec4 p111;
  Vec4 p011;
  Vec4 p101;
  Vec4 p001;
  Vec4 p110;
  Vec4 p010;
  Vec4 p100;
  Vec4 p000;
  float local_2e0;
  float local_2dc;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [32];
  tcu local_200 [16];
  tcu local_1f0 [16];
  tcu local_1e0 [16];
  tcu local_1d0 [16];
  tcu local_1c0 [16];
  tcu local_1b0 [16];
  tcu local_1a0 [16];
  tcu local_190 [16];
  tcu local_180 [16];
  tcu local_170 [16];
  tcu local_160 [16];
  tcu local_150 [16];
  tcu local_140 [16];
  tcu local_130 [16];
  tcu local_120 [16];
  tcu local_110 [16];
  tcu local_100 [16];
  tcu local_f0 [16];
  tcu local_e0 [16];
  tcu local_d0 [16];
  tcu local_c0 [16];
  tcu local_b0 [16];
  tcu local_a0 [16];
  tcu local_90 [16];
  tcu local_80 [16];
  tcu local_70 [16];
  tcu local_60 [16];
  tcu local_50 [16];
  tcu local_40 [16];
  undefined1 auVar34 [12];
  undefined8 uVar35;
  
  uVar31 = CONCAT44(in_XMM1_Db,t);
  sampler_00 = (Sampler *)CONCAT44(in_register_00000014,filter);
  local_2e0 = t;
  local_2dc = s;
  if (sampler_00->normalizedCoords == true) {
    local_2dc = unnormalize(sampler_00->wrapS,s,sampler->wrapR);
    local_2e0 = unnormalize(sampler_00->wrapT,t,sampler->minFilter);
    r = unnormalize(sampler_00->wrapR,r,sampler->magFilter);
  }
  i = (int)sampler;
  if ((int)offset == 1) {
    WVar1 = sampler->wrapR;
    FVar2 = sampler->minFilter;
    FVar3 = sampler->magFilter;
    fVar28 = floorf(local_2dc + -0.5);
    iVar16 = *in_R8;
    iVar17 = in_R8[1];
    fVar29 = floorf(local_2e0 + -0.5);
    fVar30 = floorf(r + -0.5);
    iVar18 = in_R8[2];
    WVar4 = sampler_00->wrapS;
    j = wrap(WVar4,iVar16 + (int)fVar28,WVar1);
    iVar16 = wrap(WVar4,iVar16 + 1 + (int)fVar28,WVar1);
    WVar5 = sampler_00->wrapT;
    k = wrap(WVar5,iVar17 + (int)fVar29,FVar2);
    iVar17 = wrap(WVar5,(int)fVar29 + iVar17 + 1,FVar2);
    mode = sampler_00->wrapR;
    iVar15 = wrap(mode,iVar18 + (int)fVar30,FVar3);
    iVar18 = wrap(mode,iVar18 + (int)fVar30 + 1,FVar3);
    bVar19 = WVar4 != CLAMP_TO_BORDER;
    bVar23 = -1 < iVar16;
    bVar7 = iVar16 < (int)WVar1;
    bVar12 = !bVar19;
    bVar22 = j < 0;
    bVar6 = (int)WVar1 <= j;
    bVar20 = WVar5 != CLAMP_TO_BORDER;
    bVar25 = -1 < iVar17;
    bVar9 = iVar17 < (int)FVar2;
    bVar13 = !bVar20;
    bVar24 = k < 0;
    bVar8 = (int)FVar2 <= k;
    bVar21 = mode != CLAMP_TO_BORDER;
    bVar27 = -1 < iVar18;
    bVar11 = iVar18 < (int)FVar3;
    bVar14 = !bVar21;
    bVar26 = iVar15 < 0;
    bVar10 = (int)FVar3 <= iVar15;
    if ((bVar12 && (bVar6 || bVar22) || bVar13 && (bVar8 || bVar24)) ||
       (bVar14 && (bVar10 || bVar26))) {
      lookupBorder((tcu *)local_220,(TextureFormat *)sampler,sampler_00);
    }
    else {
      lookup((ConstPixelBufferAccess *)local_220,i,j,k);
    }
    if (((!bVar13 || !bVar8 && !bVar24) && (bVar19 || bVar7 && bVar23)) &&
        (!bVar14 || !bVar10 && !bVar26)) {
      lookup((ConstPixelBufferAccess *)local_230,i,iVar16,k);
    }
    else {
      lookupBorder((tcu *)local_230,(TextureFormat *)sampler,sampler_00);
    }
    if (((!bVar12 || !bVar6 && !bVar22) && (bVar20 || bVar9 && bVar25)) &&
        (!bVar14 || !bVar10 && !bVar26)) {
      lookup((ConstPixelBufferAccess *)local_240,i,j,iVar17);
    }
    else {
      lookupBorder((tcu *)local_240,(TextureFormat *)sampler,sampler_00);
    }
    if ((!bVar14 || !bVar10 && !bVar26) &&
        ((bVar19 || bVar7 && bVar23) && (bVar20 || bVar9 && bVar25))) {
      lookup((ConstPixelBufferAccess *)local_250,i,iVar16,iVar17);
    }
    else {
      lookupBorder((tcu *)local_250,(TextureFormat *)sampler,sampler_00);
    }
    if (((!bVar12 || !bVar6 && !bVar22) && (!bVar13 || !bVar8 && !bVar24)) &&
        (bVar21 || bVar11 && bVar27)) {
      lookup((ConstPixelBufferAccess *)local_260,i,j,k);
    }
    else {
      lookupBorder((tcu *)local_260,(TextureFormat *)sampler,sampler_00);
    }
    if (((!bVar13 || !bVar8 && !bVar24) && (bVar19 || bVar7 && bVar23)) &&
        (bVar21 || bVar11 && bVar27)) {
      lookup((ConstPixelBufferAccess *)local_270,i,iVar16,k);
    }
    else {
      lookupBorder((tcu *)local_270,(TextureFormat *)sampler,sampler_00);
    }
    if (((!bVar12 || !bVar6 && !bVar22) && (bVar20 || bVar9 && bVar25)) &&
        (bVar21 || bVar11 && bVar27)) {
      lookup((ConstPixelBufferAccess *)local_280,i,j,iVar17);
    }
    else {
      lookupBorder((tcu *)local_280,(TextureFormat *)sampler,sampler_00);
    }
    if (((bVar19 || bVar7 && bVar23) && (bVar20 || bVar9 && bVar25)) && (bVar21 || bVar11 && bVar27)
       ) {
      lookup((ConstPixelBufferAccess *)local_290,i,iVar16,iVar17);
    }
    else {
      lookupBorder((tcu *)local_290,(TextureFormat *)sampler,sampler_00);
    }
    fVar30 = (r + -0.5) - fVar30;
    fVar29 = (local_2e0 + -0.5) - fVar29;
    fVar28 = (local_2dc + -0.5) - fVar28;
    s_00 = 1.0 - fVar28;
    operator*(local_c0,s_00,(Vector<float,_4> *)local_220);
    s_01 = 1.0 - fVar29;
    operator*(local_b0,s_01,(Vector<float,_4> *)local_c0);
    s_02 = 1.0 - fVar30;
    operator*(local_a0,s_02,(Vector<float,_4> *)local_b0);
    operator*(local_f0,fVar28,(Vector<float,_4> *)local_230);
    operator*(local_e0,s_01,(Vector<float,_4> *)local_f0);
    operator*(local_d0,s_02,(Vector<float,_4> *)local_e0);
    operator+(local_90,(Vector<float,_4> *)local_a0,(Vector<float,_4> *)local_d0);
    operator*(local_120,s_00,(Vector<float,_4> *)local_240);
    operator*(local_110,fVar29,(Vector<float,_4> *)local_120);
    operator*(local_100,s_02,(Vector<float,_4> *)local_110);
    operator+(local_80,(Vector<float,_4> *)local_90,(Vector<float,_4> *)local_100);
    operator*(local_150,fVar28,(Vector<float,_4> *)local_250);
    operator*(local_140,fVar29,(Vector<float,_4> *)local_150);
    operator*(local_130,s_02,(Vector<float,_4> *)local_140);
    operator+(local_70,(Vector<float,_4> *)local_80,(Vector<float,_4> *)local_130);
    operator*(local_180,s_00,(Vector<float,_4> *)local_260);
    operator*(local_170,s_01,(Vector<float,_4> *)local_180);
    operator*(local_160,fVar30,(Vector<float,_4> *)local_170);
    operator+(local_60,(Vector<float,_4> *)local_70,(Vector<float,_4> *)local_160);
    operator*(local_1b0,fVar28,(Vector<float,_4> *)local_270);
    operator*(local_1a0,s_01,(Vector<float,_4> *)local_1b0);
    operator*(local_190,fVar30,(Vector<float,_4> *)local_1a0);
    operator+(local_50,(Vector<float,_4> *)local_60,(Vector<float,_4> *)local_190);
    operator*(local_1e0,s_00,(Vector<float,_4> *)local_280);
    operator*(local_1d0,fVar29,(Vector<float,_4> *)local_1e0);
    operator*(local_1c0,fVar30,(Vector<float,_4> *)local_1d0);
    operator+(local_40,(Vector<float,_4> *)local_50,(Vector<float,_4> *)local_1c0);
    operator*((tcu *)(local_220 + 0x10),fVar28,(Vector<float,_4> *)local_290);
    operator*(local_200,fVar29,(Vector<float,_4> *)(local_220 + 0x10));
    operator*(local_1f0,fVar30,(Vector<float,_4> *)local_200);
    VVar32.m_data =
         (float  [4])
         operator+((tcu *)this,(Vector<float,_4> *)local_40,(Vector<float,_4> *)local_1f0);
  }
  else if ((int)offset == 0) {
    WVar1 = sampler->wrapR;
    FVar2 = sampler->minFilter;
    FVar3 = sampler->magFilter;
    fVar28 = floorf(local_2dc);
    iVar16 = (int)fVar28 + *in_R8;
    fVar28 = floorf(local_2e0);
    iVar17 = (int)fVar28 + in_R8[1];
    fVar28 = floorf(r);
    iVar18 = (int)fVar28 + in_R8[2];
    if ((((sampler_00->wrapS == CLAMP_TO_BORDER) && ((int)WVar1 <= iVar16 || iVar16 < 0)) ||
        ((WVar4 = sampler_00->wrapT, WVar4 == CLAMP_TO_BORDER &&
         ((int)FVar2 <= iVar17 || iVar17 < 0)))) ||
       ((WVar5 = sampler_00->wrapR, WVar5 == CLAMP_TO_BORDER && (iVar18 < 0 || (int)FVar3 <= iVar18)
        ))) {
      VVar32 = lookupBorder((tcu *)this,(TextureFormat *)sampler,sampler_00);
    }
    else {
      iVar16 = wrap(sampler_00->wrapS,iVar16,WVar1);
      iVar17 = wrap(WVar4,iVar17,FVar2);
      wrap(WVar5,iVar18,FVar3);
      VVar32 = lookup(this,i,iVar16,iVar17);
    }
  }
  else {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar32.m_data[2] = (float)(int)uVar31;
    VVar32.m_data[3] = (float)(int)((ulong)uVar31 >> 0x20);
    VVar32.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar32.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar33.m_data[0] = VVar32.m_data[0];
  auVar34._4_4_ = VVar32.m_data[1];
  register0x00001240 = VVar32.m_data[2];
  register0x00001244 = VVar32.m_data[3];
  return (Vec4)VVar33.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::sample3DOffset (const Sampler& sampler, Sampler::FilterMode filter, float s, float t, float r, const IVec3& offset) const
{
	// Non-normalized coordinates.
	float u = s;
	float v = t;
	float w = r;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, m_size.x());
		v = unnormalize(sampler.wrapT, t, m_size.y());
		w = unnormalize(sampler.wrapR, r, m_size.z());
	}

	switch (filter)
	{
		case Sampler::NEAREST:	return sampleNearest3D	(*this, sampler, u, v, w, offset);
		case Sampler::LINEAR:	return sampleLinear3D	(*this, sampler, u, v, w, offset);
		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}